

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>,_std::pair<const_S2BooleanOperation::SourceId,_int>_&,_std::pair<const_S2BooleanOperation::SourceId,_int>_*>
 __thiscall
gtl::internal_btree::
btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,int,std::less<S2BooleanOperation::SourceId>,std::allocator<std::pair<S2BooleanOperation::SourceId_const,int>>,256,false>>
::
internal_find_unique<S2BooleanOperation::SourceId,gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,int,std::less<S2BooleanOperation::SourceId>,std::allocator<std::pair<S2BooleanOperation::SourceId_const,int>>,256,false>>,std::pair<S2BooleanOperation::SourceId_const,int>&,std::pair<S2BooleanOperation::SourceId_const,int>*>>
          (btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,int,std::less<S2BooleanOperation::SourceId>,std::allocator<std::pair<S2BooleanOperation::SourceId_const,int>>,256,false>>
           *this,SourceId *key,
          btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>,_std::pair<const_S2BooleanOperation::SourceId,_int>_&,_std::pair<const_S2BooleanOperation::SourceId,_int>_*>
          iter)

{
  bool bVar1;
  key_type *pkVar2;
  btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
  *pbVar3;
  undefined8 extraout_RDX;
  ulong uVar4;
  pair<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>,_std::pair<const_S2BooleanOperation::SourceId,_int>_&,_std::pair<const_S2BooleanOperation::SourceId,_int>_*>,_int>
  *ppVar5;
  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>,_std::pair<const_S2BooleanOperation::SourceId,_int>_&,_std::pair<const_S2BooleanOperation::SourceId,_int>_*>
  iter_00;
  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>,_std::pair<const_S2BooleanOperation::SourceId,_int>_&,_std::pair<const_S2BooleanOperation::SourceId,_int>_*>
  bVar6;
  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>,_std::pair<const_S2BooleanOperation::SourceId,_int>_&,_std::pair<const_S2BooleanOperation::SourceId,_int>_*>
  bVar7;
  pair<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>,_std::pair<const_S2BooleanOperation::SourceId,_int>_&,_std::pair<const_S2BooleanOperation::SourceId,_int>_*>,_int>
  res;
  undefined1 local_38 [16];
  pair<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>,_std::pair<const_S2BooleanOperation::SourceId,_int>_&,_std::pair<const_S2BooleanOperation::SourceId,_int>_*>,_int>
  local_28;
  
  local_38._0_8_ = iter.node;
  ppVar5 = (pair<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>,_std::pair<const_S2BooleanOperation::SourceId,_int>_&,_std::pair<const_S2BooleanOperation::SourceId,_int>_*>,_int>
            *)local_38;
  if ((btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
       *)local_38._0_8_ !=
      (btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
       *)0x0) {
    bVar6._12_4_ = 0;
    bVar6.node = (btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
                  *)SUB128(iter._0_12_,0);
    bVar6.position = SUB124(iter._0_12_,8);
    internal_locate_plain_compare<S2BooleanOperation::SourceId,gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,int,std::less<S2BooleanOperation::SourceId>,std::allocator<std::pair<S2BooleanOperation::SourceId_const,int>>,256,false>>,std::pair<S2BooleanOperation::SourceId_const,int>&,std::pair<S2BooleanOperation::SourceId_const,int>*>>
              (&local_28,this,key,bVar6);
    if (local_28.second == 0) {
      iter_00.node = (btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
                      *)(ulong)(uint)local_28.first.position;
      iter_00._8_8_ = extraout_RDX;
      bVar6 = internal_last<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,int,std::less<S2BooleanOperation::SourceId>,std::allocator<std::pair<S2BooleanOperation::SourceId_const,int>>,256,false>>,std::pair<S2BooleanOperation::SourceId_const,int>&,std::pair<S2BooleanOperation::SourceId_const,int>*>>
                        ((btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,int,std::less<S2BooleanOperation::SourceId>,std::allocator<std::pair<S2BooleanOperation::SourceId_const,int>>,256,false>>
                          *)local_28.first.node,iter_00);
      local_38._0_8_ = bVar6.node;
      local_38._8_4_ = bVar6.position;
      if ((btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
           *)local_38._0_8_ !=
          (btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
           *)0x0) {
        pkVar2 = btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>,_std::pair<const_S2BooleanOperation::SourceId,_int>_&,_std::pair<const_S2BooleanOperation::SourceId,_int>_*>
                 ::key((btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>,_std::pair<const_S2BooleanOperation::SourceId,_int>_&,_std::pair<const_S2BooleanOperation::SourceId,_int>_*>
                        *)local_38);
        bVar1 = S2BooleanOperation::SourceId::operator<(key,*pkVar2);
        if (!bVar1) goto LAB_001ede24;
      }
    }
    else {
      ppVar5 = &local_28;
      if (local_28.second == 0x40000000) {
LAB_001ede24:
        uVar4 = (ulong)(uint)(ppVar5->first).position;
        pbVar3 = (ppVar5->first).node;
        goto LAB_001ede2b;
      }
    }
  }
  uVar4 = 0;
  pbVar3 = (btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
            *)0x0;
LAB_001ede2b:
  bVar7._8_8_ = uVar4;
  bVar7.node = pbVar3;
  return bVar7;
}

Assistant:

IterType btree<P>::internal_find_unique(
    const K &key, IterType iter) const {
  const_lookup_key_reference<K> lookup_key(key);
  if (iter.node) {
    std::pair<IterType, int> res = internal_locate(lookup_key, iter);
    if (res.second == kExactMatch) {
      return res.first;
    }
    if (!res.second) {
      iter = internal_last(res.first);
      if (iter.node && !compare_keys(lookup_key, iter.key())) {
        return iter;
      }
    }
  }
  return IterType(nullptr, 0);
}